

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O0

json * nanojson3::json::json_reader<const_char_*>::read_json
                 (json *__return_storage_ptr__,char *begin,char *end,json_parse_option loose_option)

{
  json_reader<const_char_*> local_70;
  json_parse_option local_28;
  json_parse_option loose_option_local;
  char *end_local;
  char *begin_local;
  
  local_28 = loose_option;
  loose_option_local = (json_parse_option)end;
  end_local = begin;
  begin_local = (char *)__return_storage_ptr__;
  json_reader(&local_70,begin,end,loose_option);
  execute(__return_storage_ptr__,&local_70);
  ~json_reader(&local_70);
  return __return_storage_ptr__;
}

Assistant:

static json read_json(CharInputIterator begin, CharInputIterator end, json_parse_option loose_option)
        {
            return json_reader(begin, end, loose_option).execute();
        }